

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.cpp
# Opt level: O2

void __thiscall FuncInfo::SetHasMaybeEscapedNestedFunc(FuncInfo *this,char16 *reason)

{
  bool bVar1;
  uint sourceContextId;
  LocalFunctionId functionId;
  int iVar2;
  undefined4 extraout_var;
  char16 *pcVar3;
  char16 *r;
  wchar local_78 [4];
  char16 debugStringBuffer [42];
  
  sourceContextId =
       Js::FunctionProxy::GetSourceContextId(&this->byteCodeFunction->super_FunctionProxy);
  functionId = Js::FunctionProxy::GetLocalFunctionId(&this->byteCodeFunction->super_FunctionProxy);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,StackFuncPhase,sourceContextId,functionId);
  if ((bVar1) && ((this->field_0xb5 & 0x20) == 0)) {
    iVar2 = (*(this->byteCodeFunction->super_FunctionProxy).super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
    pcVar3 = Js::FunctionProxy::GetDebugNumberSet
                       (&this->byteCodeFunction->super_FunctionProxy,(wchar (*) [42])local_78);
    Output::Print(L"HasMaybeEscapedNestedFunc (%s): %s (function %s)\n",reason,
                  CONCAT44(extraout_var,iVar2),pcVar3);
    Output::Flush();
  }
  this->field_0xb5 = this->field_0xb5 | 0x20;
  return;
}

Assistant:

void FuncInfo::SetHasMaybeEscapedNestedFunc(DebugOnly(char16 const * reason))
{
    if (PHASE_TESTTRACE(Js::StackFuncPhase, this->byteCodeFunction) && !hasEscapedUseNestedFunc)
    {
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        char16 const * r = _u("");

        DebugOnly(r = reason);
        Output::Print(_u("HasMaybeEscapedNestedFunc (%s): %s (function %s)\n"),
            r,
            this->byteCodeFunction->GetDisplayName(),
            this->byteCodeFunction->GetDebugNumberSet(debugStringBuffer));
        Output::Flush();
    }
    hasEscapedUseNestedFunc = true;
}